

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int __thiscall
despot::Parser::ComputeNumOfEntries
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *instance,vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents,
          NamedVar *child)

{
  pointer pbVar1;
  bool bVar2;
  NamedVar *pNVar3;
  int iVar4;
  long lVar5;
  int i;
  ulong uVar6;
  
  iVar4 = 1;
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    pbVar1 = (instance->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(instance->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6)
    break;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar5),"-");
    if (bVar2) {
      pNVar3 = child;
      if (uVar6 < ((long)(instance->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(instance->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        pNVar3 = (parents->
                 super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar6];
      }
      iVar4 = iVar4 * (int)((ulong)((long)(pNVar3->super_Variable).values_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pNVar3->super_Variable).values_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5);
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x20;
  }
  return iVar4;
}

Assistant:

int Parser::ComputeNumOfEntries(const vector<string>& instance,
	const vector<NamedVar*>& parents, const NamedVar* child) const {
	int num_entries = 1;
	for (int i = 0; i < instance.size(); i++) {
		if (instance[i] == "-") {
			if (i < instance.size() - 1)
				num_entries *= parents[i]->Size();
			else
				num_entries *= child->Size();
		}
	}
	return num_entries;
}